

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O1

bool __thiscall
QTranslator::load(QTranslator *this,QString *filename,QString *directory,QString *search_delimiters,
                 QString *suffix)

{
  QTranslatorPrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  storage_type_conflict *psVar5;
  bool bVar6;
  QtPrivate *pQVar7;
  char16_t *pcVar8;
  CaseSensitivity in_R9D;
  QtPrivate *pQVar9;
  long lVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  char cVar12;
  QStringView haystack;
  QFileInfo fi;
  QArrayData *local_100;
  QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&> local_e0;
  QString local_c8;
  QFileInfo local_b0;
  QString local_a8;
  QStringView local_88;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTranslatorPrivate *)(this->super_QObject).d_ptr.d;
  QTranslatorPrivate::clear(this_00);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_78,filename);
  bVar6 = QFileInfo::isRelative((QFileInfo *)&local_78);
  QFileInfo::~QFileInfo((QFileInfo *)&local_78);
  if (((bVar6) && (QString::operator=(&local_58,directory), local_58.d.size != 0)) &&
     (bVar6 = QString::endsWith(&local_58,(QChar)0x2f,CaseSensitive), !bVar6)) {
    QString::append(&local_58,(QChar)0x2f);
  }
  local_78.d.ptr = (suffix->d).ptr;
  if (local_78.d.ptr == (char16_t *)0x0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L".qm";
    local_78.d.size = 3;
  }
  else {
    local_78.d.d = (suffix->d).d;
    local_78.d.size = (suffix->d).size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_88.m_data = (filename->d).ptr;
  local_88.m_size = (filename->d).size;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  pcVar8 = (search_delimiters->d).ptr;
  if (pcVar8 == (char16_t *)0x0) {
    qVar11 = 2;
    pcVar8 = L"_.";
    local_100 = (QArrayData *)0x0;
  }
  else {
    local_100 = &((search_delimiters->d).d)->super_QArrayData;
    qVar11 = (search_delimiters->d).size;
    if (local_100 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_100->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_100->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  do {
    local_b0.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_b0);
    local_e0.a.b = &local_88;
    local_e0.b = &local_78;
    local_e0.a.a = &local_58;
    QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&>::convertTo<QString>
              (&local_c8,&local_e0);
    pcVar4 = local_a8.d.ptr;
    pDVar3 = local_a8.d.d;
    qVar2 = local_c8.d.size;
    pDVar1 = local_c8.d.d;
    local_c8.d.d = local_a8.d.d;
    local_a8.d.d = pDVar1;
    local_a8.d.ptr = local_c8.d.ptr;
    local_c8.d.ptr = pcVar4;
    local_c8.d.size = local_a8.d.size;
    local_a8.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::setFile(&local_b0,&local_a8);
    bVar6 = QFileInfo::isReadable(&local_b0);
    if (bVar6) {
      bVar6 = QFileInfo::isFile(&local_b0);
      cVar12 = '\x02';
      if (!bVar6) goto LAB_002cf6c6;
    }
    else {
LAB_002cf6c6:
      local_e0.a.b = &local_88;
      local_e0.a.a = &local_58;
      QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>(&local_c8,&local_e0.a);
      pcVar4 = local_a8.d.ptr;
      pDVar3 = local_a8.d.d;
      qVar2 = local_c8.d.size;
      pDVar1 = local_c8.d.d;
      local_c8.d.d = local_a8.d.d;
      local_a8.d.d = pDVar1;
      local_a8.d.ptr = local_c8.d.ptr;
      local_c8.d.ptr = pcVar4;
      local_c8.d.size = local_a8.d.size;
      local_a8.d.size = qVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      QFileInfo::setFile(&local_b0,&local_a8);
      bVar6 = QFileInfo::isReadable(&local_b0);
      if (bVar6) {
        bVar6 = QFileInfo::isFile(&local_b0);
        cVar12 = '\x02';
        if (bVar6) goto LAB_002cf7d2;
      }
      psVar5 = local_88.m_data;
      qVar2 = local_88.m_size;
      if (qVar11 == 0) {
        pQVar7 = (QtPrivate *)0x0;
      }
      else {
        lVar10 = 0;
        pQVar9 = (QtPrivate *)0x0;
        do {
          haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
          haystack.m_size = (qsizetype)psVar5;
          pQVar7 = (QtPrivate *)
                   QtPrivate::lastIndexOf
                             ((QtPrivate *)qVar2,haystack,(ulong)*(ushort *)((long)pcVar8 + lVar10),
                              L'\x01',in_R9D);
          if ((long)pQVar7 < (long)pQVar9) {
            pQVar7 = pQVar9;
          }
          lVar10 = lVar10 + 2;
          pQVar9 = pQVar7;
        } while (qVar11 * 2 != lVar10);
      }
      cVar12 = pQVar7 == (QtPrivate *)0x0;
      if (!(bool)cVar12) {
        local_88.m_size = (qsizetype)pQVar7;
      }
    }
LAB_002cf7d2:
    QFileInfo::~QFileInfo(&local_b0);
    if (cVar12 != '\0') {
      if (cVar12 == '\x02') {
        bVar6 = QTranslatorPrivate::do_load(this_00,&local_a8,directory);
      }
      else {
        bVar6 = false;
      }
      if (local_100 != (QArrayData *)0x0) {
        LOCK();
        (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_100,2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return bVar6;
    }
  } while( true );
}

Assistant:

bool QTranslator::load(const QString & filename, const QString & directory,
                       const QString & search_delimiters,
                       const QString & suffix)
{
    Q_D(QTranslator);
    d->clear();

    QString prefix;
    if (QFileInfo(filename).isRelative()) {
        prefix = directory;
        if (prefix.size() && !prefix.endsWith(u'/'))
            prefix += u'/';
    }

    const QString suffixOrDotQM = suffix.isNull() ? dotQmLiteral() : suffix;
    QStringView fname(filename);
    QString realname;
    const QString delims = search_delimiters.isNull() ? QStringLiteral("_.") : search_delimiters;

    for (;;) {
        QFileInfo fi;

        realname = prefix + fname + suffixOrDotQM;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        realname = prefix + fname;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        qsizetype rightmost = 0;
        for (auto ch : delims)
            rightmost = std::max(rightmost, fname.lastIndexOf(ch));

        // no truncations? fail
        if (rightmost == 0)
            return false;

        fname.truncate(rightmost);
    }

    // realname is now the fully qualified name of a readable file.
    return d->do_load(realname, directory);
}